

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::CaptureNamedGroups(void)

{
  int iVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar2;
  size_type sVar3;
  pointer ppVar4;
  ostream *poVar5;
  LogMessage local_ea8;
  allocator local_d21;
  string local_d20 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_d00;
  LogMessage local_cf8;
  allocator local_b71;
  string local_b70 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_b50;
  LogMessage local_b48;
  allocator local_9c1;
  string local_9c0 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_9a0;
  LogMessage local_998;
  allocator local_811;
  string local_810 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_7f0;
  LogMessage local_7e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_668;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *m_1;
  undefined1 local_4e0 [8];
  RE2 re_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *m;
  undefined1 local_e8 [8];
  RE2 re;
  
  RE2::RE2((RE2 *)local_e8,"(hello world)");
  iVar1 = RE2::NumberOfCapturingGroups((RE2 *)local_e8);
  if (iVar1 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&m,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x213);
    poVar5 = LogMessage::stream((LogMessage *)&m);
    std::operator<<(poVar5,"Check failed: (re.NumberOfCapturingGroups()) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m);
  }
  pmVar2 = RE2::NamedCapturingGroups_abi_cxx11_((RE2 *)local_e8);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(pmVar2);
  if (sVar3 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_1.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x215);
    poVar5 = LogMessage::stream((LogMessage *)&re_1.named_groups_once_);
    std::operator<<(poVar5,"Check failed: (m.size()) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_1.named_groups_once_);
  }
  RE2::~RE2((RE2 *)local_e8);
  RE2::RE2((RE2 *)local_4e0,"(?P<A>expr(?P<B>expr)(?P<C>expr))((expr)(?P<D>expr))");
  iVar1 = RE2::NumberOfCapturingGroups((RE2 *)local_4e0);
  if (iVar1 != 6) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&m_1,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21a);
    poVar5 = LogMessage::stream((LogMessage *)&m_1);
    std::operator<<(poVar5,"Check failed: (re.NumberOfCapturingGroups()) == (6)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m_1);
  }
  local_668 = RE2::NamedCapturingGroups_abi_cxx11_((RE2 *)local_4e0);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(local_668);
  if (sVar3 != 4) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_7e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21c);
    poVar5 = LogMessage::stream(&local_7e8);
    std::operator<<(poVar5,"Check failed: (m.size()) == (4)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7e8);
  }
  pmVar2 = local_668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"A",&local_811);
  local_7f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar2,(key_type *)local_810);
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_7f0);
  iVar1 = ppVar4->second;
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  if (iVar1 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_998,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21d);
    poVar5 = LogMessage::stream(&local_998);
    std::operator<<(poVar5,"Check failed: (m.find(\"A\")->second) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_998);
  }
  pmVar2 = local_668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"B",&local_9c1);
  local_9a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar2,(key_type *)local_9c0);
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_9a0);
  iVar1 = ppVar4->second;
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  if (iVar1 != 2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b48,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21e);
    poVar5 = LogMessage::stream(&local_b48);
    std::operator<<(poVar5,"Check failed: (m.find(\"B\")->second) == (2)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b48);
  }
  pmVar2 = local_668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b70,"C",&local_b71);
  local_b50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar2,(key_type *)local_b70);
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_b50);
  iVar1 = ppVar4->second;
  std::__cxx11::string::~string(local_b70);
  std::allocator<char>::~allocator((allocator<char> *)&local_b71);
  if (iVar1 != 3) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_cf8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x21f);
    poVar5 = LogMessage::stream(&local_cf8);
    std::operator<<(poVar5,"Check failed: (m.find(\"C\")->second) == (3)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_cf8);
  }
  pmVar2 = local_668;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"D",&local_d21);
  local_d00._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar2,(key_type *)local_d20);
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_d00);
  iVar1 = ppVar4->second;
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  if (iVar1 != 6) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ea8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x220);
    poVar5 = LogMessage::stream(&local_ea8);
    std::operator<<(poVar5,"Check failed: (m.find(\"D\")->second) == (6)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ea8);
  }
  RE2::~RE2((RE2 *)local_4e0);
  return;
}

Assistant:

TEST(Capture, NamedGroups) {
  {
    RE2 re("(hello world)");
    CHECK_EQ(re.NumberOfCapturingGroups(), 1);
    const map<string, int>& m = re.NamedCapturingGroups();
    CHECK_EQ(m.size(), 0);
  }

  {
    RE2 re("(?P<A>expr(?P<B>expr)(?P<C>expr))((expr)(?P<D>expr))");
    CHECK_EQ(re.NumberOfCapturingGroups(), 6);
    const map<string, int>& m = re.NamedCapturingGroups();
    CHECK_EQ(m.size(), 4);
    CHECK_EQ(m.find("A")->second, 1);
    CHECK_EQ(m.find("B")->second, 2);
    CHECK_EQ(m.find("C")->second, 3);
    CHECK_EQ(m.find("D")->second, 6);  // $4 and $5 are anonymous
  }
}